

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O3

int __thiscall H264StreamReader::processSEI(H264StreamReader *this,uint8_t *buff)

{
  uint8_t **ppuVar1;
  uint8_t *puVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint8_t *end;
  __node_base _Var6;
  undefined4 *puVar7;
  bool bVar8;
  SEIUnit lastSEI;
  ostringstream ss;
  uint8_t tmpBuff [3072];
  uint *local_f80;
  undefined8 local_f78;
  uint local_f70;
  undefined4 uStack_f6c;
  undefined4 uStack_f68;
  undefined4 uStack_f64;
  uint *local_f60;
  undefined8 local_f58;
  uint local_f50;
  undefined4 uStack_f4c;
  undefined4 uStack_f48;
  undefined4 uStack_f44;
  SEIUnit local_f40;
  ostringstream local_da0 [376];
  uint8_t local_c28 [3072];
  
  if ((this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    return 0;
  }
  local_f40.m_processedMessages._M_h._M_buckets =
       &local_f40.m_processedMessages._M_h._M_single_bucket;
  local_f40.super_NALUnit.bitReader.super_BitStream.m_totalBits = 0;
  local_f40.super_NALUnit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
  local_f40.super_NALUnit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
  local_f40.super_NALUnit.bitReader.m_curVal = 0;
  local_f40.super_NALUnit.bitReader.m_bitLeft = 0;
  local_f40.super_NALUnit.nal_unit_type = nuUnspecified;
  local_f40.super_NALUnit.nal_ref_idc = 0;
  local_f40.super_NALUnit.m_nalBuffer = (uint8_t *)0x0;
  local_f40.super_NALUnit.m_nalBufferLen = 0;
  local_f40.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__SEIUnit_0023d5a0;
  local_f40.pic_struct = '\0';
  local_f40.m_processedMessages._M_h._M_bucket_count = 1;
  local_f40.m_processedMessages._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f40.m_processedMessages._M_h._M_element_count = 0;
  local_f40.m_processedMessages._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&local_f40.m_processedMessages._M_h._M_rehash_policy._M_next_resize,0,0x118);
  local_f40.number_of_offset_sequences = -1;
  local_f40.metadataPtsOffset = 0;
  local_f40.m_mvcHeaderLen = 0;
  local_f40.m_mvcHeaderStart = (uint8_t *)0x0;
  end = NALUnit::findNALWithStartCode
                  (buff,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,true);
  puVar2 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
  if (puVar2 < end + 4 || end == puVar2) {
    SEIUnit::~SEIUnit(&local_f40);
    return -10;
  }
  local_f40.pic_struct = -1;
  NALUnit::decodeBuffer(&local_f40.super_NALUnit,buff,end);
  uVar4 = 1;
  if (this->orig_hrd_parameters_present_flag == false) {
    uVar4 = (uint)this->orig_vcl_parameters_present_flag;
  }
  SEIUnit::deserialize
            (&local_f40,
             (SPSUnit *)
             (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent,
             uVar4);
  if (local_f40.m_processedMessages._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
    bVar8 = false;
    bVar3 = false;
  }
  else {
    bVar3 = false;
    bVar8 = false;
    _Var6._M_nxt = local_f40.m_processedMessages._M_h._M_before_begin._M_nxt;
    do {
      iVar5 = *(int *)&_Var6._M_nxt[1]._M_nxt;
      if (iVar5 == 0) {
LAB_001871a7:
        bVar3 = true;
      }
      else if (iVar5 != 0x25) {
        if (iVar5 == 1) {
          this->m_lastPictStruct = local_f40.pic_struct;
          goto LAB_001871a7;
        }
        bVar8 = true;
      }
      _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt;
    } while (_Var6._M_nxt != (_Hash_node_base *)0x0);
  }
  if (this->m_mvcSubStream == false) {
LAB_0018726e:
    if (!bVar3) goto LAB_00187321;
  }
  else {
    if (-1 < local_f40.number_of_offset_sequences) {
      if (this->m_needSeiCorrection == true) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this->m_bdRomMetaDataMsg,(ulong)local_f40.super_NALUnit.m_nalBufferLen);
        this->m_bdRomMetaDataMsgPtsPos = local_f40.metadataPtsOffset;
        memcpy((this->m_bdRomMetaDataMsg).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,local_f40.super_NALUnit.m_nalBuffer,
               (ulong)local_f40.super_NALUnit.m_nalBufferLen);
      }
      else {
        this->m_priorityNalAddr = buff;
        this->m_OffsetMetadataPtsAddr = buff + local_f40.metadataPtsOffset;
      }
    }
    if (!(bool)(0 < local_f40.m_mvcHeaderLen & bVar3)) goto LAB_0018726e;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->m_lastSeiMvcHeader,(ulong)(uint)local_f40.m_mvcHeaderLen);
    memcpy((this->m_lastSeiMvcHeader).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,local_f40.m_mvcHeaderStart,
           (long)local_f40.m_mvcHeaderLen);
  }
  if ((bVar8) && (this->m_needSeiCorrection == true)) {
    SEIUnit::removePicTimingSEI
              (&local_f40,
               (SPSUnit *)
               (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent);
    uVar4 = NALUnit::serializeBuffer
                      (&local_f40.super_NALUnit,local_c28,&stack0xffffffffffffffd8,false);
    if (uVar4 == 0xffffffff) {
      std::__cxx11::ostringstream::ostringstream(local_da0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_da0,"Not enough buffer",0x11);
      puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar7 = 3;
      *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
      if (local_f60 == &local_f50) {
        puVar7[6] = local_f50;
        puVar7[7] = uStack_f4c;
        puVar7[8] = uStack_f48;
        puVar7[9] = uStack_f44;
      }
      else {
        *(uint **)(puVar7 + 2) = local_f60;
        *(ulong *)(puVar7 + 6) = CONCAT44(uStack_f4c,local_f50);
      }
      *(undefined8 *)(puVar7 + 4) = local_f58;
      local_f58 = 0;
      local_f50 = local_f50 & 0xffffff00;
      local_f60 = &local_f50;
      __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    if ((int)uVar4 < 3) {
      __assert_fail("newSize > 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/h264StreamReader.cpp"
                    ,0x3e6,"int H264StreamReader::processSEI(uint8_t *)");
    }
    iVar5 = ((int)buff - (int)end) + uVar4;
    if (iVar5 != 0) {
      puVar2 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
      if ((this->super_MPEGStreamReader).m_tmpBuffer + 0x800000 < puVar2 + iVar5) {
        std::__cxx11::ostringstream::ostringstream(local_da0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_da0,"Not enough buffer",0x11);
        puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar7 = 3;
        *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
        if (local_f80 == &local_f70) {
          puVar7[6] = local_f70;
          puVar7[7] = uStack_f6c;
          puVar7[8] = uStack_f68;
          puVar7[9] = uStack_f64;
        }
        else {
          *(uint **)(puVar7 + 2) = local_f80;
          *(ulong *)(puVar7 + 6) = CONCAT44(uStack_f6c,local_f70);
        }
        *(undefined8 *)(puVar7 + 4) = local_f78;
        local_f70 = local_f70 & 0xffffff00;
        __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      memmove(end + iVar5,end,(long)puVar2 - (long)end);
      ppuVar1 = &(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
      *ppuVar1 = *ppuVar1 + iVar5;
    }
    memcpy(buff,local_c28,(ulong)uVar4);
  }
LAB_00187321:
  SEIUnit::~SEIUnit(&local_f40);
  return 0;
}

Assistant:

bool H264StreamReader::findPPSForward(uint8_t *buff)
{
    bool spsFound = false;
    bool ppsFound = false;
    for (uint8_t *nal = NALUnit::findNextNAL(buff, m_bufEnd); nal != m_bufEnd;
         nal = NALUnit::findNextNAL(nal, m_bufEnd))
        switch (static_cast<NALUnit::NALType>(*nal & 0x1f))
        {
        case NALUnit::NALType::nuSPS:
        case NALUnit::NALType::nuSubSPS:
            processSPS(nal);
            spsFound = true;
            break;
        case NALUnit::NALType::nuPPS:
            processPPS(nal);
            ppsFound = true;
            break;
        default:
            break;
        }
    return spsFound && ppsFound;
}